

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O3

void absl::lts_20250127::str_format_internal::anon_unknown_0::PrintExponent
               (int exp,char e,Buffer *out)

{
  undefined1 *puVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  
  pcVar2 = out->end;
  puVar1 = &out->field_0x55;
  if (pcVar2 < puVar1) {
    out->end = pcVar2 + 1;
    *pcVar2 = e;
    pcVar2 = out->end;
    if (exp < 0) {
      if (puVar1 <= pcVar2) goto LAB_002d2ef6;
      out->end = pcVar2 + 1;
      *pcVar2 = '-';
      exp = -exp;
    }
    else {
      if (puVar1 <= pcVar2) goto LAB_002d2ef6;
      out->end = pcVar2 + 1;
      *pcVar2 = '+';
    }
    pbVar3 = (byte *)out->end;
    if ((uint)exp < 100) {
      if (pbVar3 < puVar1) {
        bVar4 = (byte)((exp & 0xffU) / 10);
        out->end = (char *)(pbVar3 + 1);
        *pbVar3 = bVar4 | 0x30;
        pbVar3 = (byte *)out->end;
        if (pbVar3 < puVar1) {
LAB_002d2ee5:
          out->end = (char *)(pbVar3 + 1);
          *pbVar3 = (char)exp + bVar4 * -10 | 0x30;
          return;
        }
      }
    }
    else if (pbVar3 < puVar1) {
      out->end = (char *)(pbVar3 + 1);
      *pbVar3 = (char)((ulong)(uint)exp / 100) + 0x30;
      pbVar3 = (byte *)out->end;
      if (pbVar3 < puVar1) {
        out->end = (char *)(pbVar3 + 1);
        *pbVar3 = (char)((uint)exp / 10) +
                  (char)(((ulong)(uint)exp / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
        pbVar3 = (byte *)out->end;
        if (pbVar3 < puVar1) {
          bVar4 = (byte)((uint)exp / 10);
          goto LAB_002d2ee5;
        }
      }
    }
  }
LAB_002d2ef6:
  __assert_fail("end < data + sizeof(data)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                ,0x3f3,
                "void absl::str_format_internal::(anonymous namespace)::Buffer::push_back(char)");
}

Assistant:

void PrintExponent(int exp, char e, Buffer *out) {
  out->push_back(e);
  if (exp < 0) {
    out->push_back('-');
    exp = -exp;
  } else {
    out->push_back('+');
  }
  // Exponent digits.
  if (exp > 99) {
    out->push_back(static_cast<char>(exp / 100 + '0'));
    out->push_back(static_cast<char>(exp / 10 % 10 + '0'));
    out->push_back(static_cast<char>(exp % 10 + '0'));
  } else {
    out->push_back(static_cast<char>(exp / 10 + '0'));
    out->push_back(static_cast<char>(exp % 10 + '0'));
  }
}